

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Call.h
# Opt level: O1

ptr<Value> __thiscall Call::evaluate(Call *this,Environment *env)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Call *pCVar6;
  long *plVar7;
  undefined4 *puVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined8 *puVar10;
  ptr<Value> pVar11;
  ValueList values;
  ptr<Value> value;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  Call *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<Value> local_40;
  
  local_58 = this;
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_bucket_count)(&local_50);
  if (local_50 == 0) {
    plVar7 = (long *)0x0;
  }
  else {
    plVar7 = (long *)__dynamic_cast(local_50,&Value::typeinfo,&Callable::typeinfo);
  }
  if (plVar7 == (long *)0x0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    plVar7 = (long *)0x0;
  }
  else {
    this_00 = local_48;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_48->_M_use_count = local_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_48->_M_use_count = local_48->_M_use_count + 1;
      }
    }
  }
  if (plVar7 != (long *)0x0) {
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    puVar10 = (undefined8 *)(env->symbols)._M_h._M_element_count;
    puVar1 = *(undefined8 **)&(env->symbols)._M_h._M_rehash_policy;
    if (puVar10 != puVar1) {
      do {
        (*(code *)**(undefined8 **)*puVar10)(&local_40);
        std::vector<std::shared_ptr<Value>,std::allocator<std::shared_ptr<Value>>>::
        emplace_back<std::shared_ptr<Value>>
                  ((vector<std::shared_ptr<Value>,std::allocator<std::shared_ptr<Value>>> *)
                   &local_88,&local_40);
        if (local_40.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        puVar10 = puVar10 + 2;
      } while (puVar10 != puVar1);
    }
    pCVar6 = local_58;
    (**(code **)(*plVar7 + 8))(local_58,plVar7,&local_88);
    std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::~vector
              ((vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *)&local_88
              );
    _Var9._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var9._M_pi = extraout_RDX_00;
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      _Var9._M_pi = extraout_RDX_01;
    }
    pVar11.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi;
    pVar11.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pCVar6;
    return (ptr<Value>)pVar11.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Value not callable","");
  ExceptionObjects::call_failed((ExceptionObjects *)&local_68,&local_88);
  uVar2 = (undefined4)local_68;
  uVar3 = local_68._4_4_;
  uVar4 = (undefined4)uStack_60;
  uVar5 = uStack_60._4_4_;
  local_68 = 0;
  uStack_60 = 0;
  *puVar8 = uVar2;
  puVar8[1] = uVar3;
  puVar8[2] = uVar4;
  puVar8[3] = uVar5;
  __cxa_throw(puVar8,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Value> value = expression -> evaluate(env);
        ptr<Callable> callable = std::dynamic_pointer_cast<Callable>(value);

        if(!callable)
            throw ThrowPacket(ExceptionObjects::call_failed("Value not callable"));

        ValueList values;
        for(auto& expr : expressionList)
            values.push_back(expr -> evaluate(env));

        return callable->call(values);
    }